

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O1

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::when_ready
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this,
          handler_type2 *handler)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  
  __mutex = &this->lock_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (this->has_result_ != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if ((handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*handler->_M_invoker)((_Any_data *)handler,this,&this->err_);
      return;
    }
    uVar2 = std::__throw_bad_function_call();
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar2);
  }
  std::
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  ::operator=(&this->handler2_,handler);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void when_ready(const handler_type2& handler) {
        bool call_handler = false;
        {   std::lock_guard<std::mutex> guard(lock_);
            if (has_result_) call_handler = true;
            else handler2_ = handler;
        }
        if (call_handler) handler(*this, err_);
    }